

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

AliasRet aa_fref(jit_State *J,IRIns *refa,IRIns *refb)

{
  short *in_RDX;
  short *in_RSI;
  IRRef unaff_retaddr;
  IRRef unaff_retaddr_00;
  AliasRet local_4;
  
  if (in_RSI[1] == in_RDX[1]) {
    if (*in_RSI == *in_RDX) {
      local_4 = ALIAS_MUST;
    }
    else if (((ushort)in_RSI[1] < 3) || (8 < (ushort)in_RSI[1])) {
      local_4 = ALIAS_MAY;
    }
    else {
      local_4 = aa_table((jit_State *)&refb->field_0,unaff_retaddr_00,unaff_retaddr);
    }
  }
  else {
    local_4 = ALIAS_NO;
  }
  return local_4;
}

Assistant:

static AliasRet aa_fref(jit_State *J, IRIns *refa, IRIns *refb)
{
  if (refa->op2 != refb->op2)
    return ALIAS_NO;  /* Different fields. */
  if (refa->op1 == refb->op1)
    return ALIAS_MUST;  /* Same field, same object. */
  else if (refa->op2 >= IRFL_TAB_META && refa->op2 <= IRFL_TAB_NOMM)
    return aa_table(J, refa->op1, refb->op1);  /* Disambiguate tables. */
  else
    return ALIAS_MAY;  /* Same field, possibly different object. */
}